

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::find_static_extensions(CompilerGLSL *this)

{
  ParsedIR *this_00;
  AddressingModel AVar1;
  int iVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  size_t sVar4;
  pointer ppVar5;
  Capability *pCVar6;
  bool bVar7;
  ExecutionModel EVar8;
  iterator __begin2;
  SPIRType *pSVar9;
  CompilerError *pCVar10;
  pointer ppVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_61;
  string local_60;
  LoopLock local_40;
  SPIREntryPoint *local_38;
  
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar3 = (this->super_Compiler).ir.ids_for_type[1].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar4 = (this->super_Compiler).ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar15 = 0; sVar4 << 2 != lVar15; lVar15 = lVar15 + 4) {
    uVar14 = *(uint *)((long)&pTVar3->id + lVar15);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar14].type ==
        TypeType) {
      pSVar9 = ParsedIR::get<spirv_cross::SPIRType>(this_00,uVar14);
      switch(pSVar9->basetype) {
      case SByte:
      case UByte:
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_EXT_shader_explicit_arithmetic_types_int8",&local_61);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string((string *)&local_60,"GL_EXT_shader_8bit_storage",&local_61)
          ;
          require_extension_internal(this,&local_60);
          goto LAB_001195be;
        }
        break;
      case Short:
      case UShort:
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_EXT_shader_explicit_arithmetic_types_int16",&local_61);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string
                    ((string *)&local_60,"GL_EXT_shader_16bit_storage",&local_61);
          require_extension_internal(this,&local_60);
          goto LAB_001195be;
        }
        break;
      case Int64:
      case UInt64:
        if (((this->options).es == true) && ((this->options).version < 0x136)) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar10,"64-bit integers not supported in ES profile before version 310.");
LAB_00119f25:
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_60,"GL_ARB_gpu_shader_int64",&local_61);
        require_extension_internal(this,&local_60);
LAB_001195be:
        ::std::__cxx11::string::~string((string *)&local_60);
        break;
      case Half:
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_EXT_shader_explicit_arithmetic_types_float16",&local_61);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        if ((this->options).vulkan_semantics == true) {
          ::std::__cxx11::string::string
                    ((string *)&local_60,"GL_EXT_shader_16bit_storage",&local_61);
          require_extension_internal(this,&local_60);
          goto LAB_001195be;
        }
        break;
      case Double:
        if ((this->options).es == true) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar10,"FP64 not supported in ES profile.");
          goto LAB_00119f25;
        }
        if ((this->options).version < 400) {
          ::std::__cxx11::string::string((string *)&local_60,"GL_ARB_gpu_shader_fp64",&local_61);
          require_extension_internal(this,&local_60);
          goto LAB_001195be;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  local_38 = Compiler::get_entry_point(&this->super_Compiler);
  EVar8 = local_38->model;
  if (EVar8 - ExecutionModelRayGenerationKHR < 6) {
    if (((this->options).es != false) || ((this->options).version < 0x1cc)) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar10,"Ray tracing shaders require non-es profile with version 460 or above.");
      goto LAB_0011a0bd;
    }
    if ((this->options).vulkan_semantics == false) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar10,"Ray tracing requires Vulkan semantics.");
      goto LAB_0011a0bd;
    }
    for (lVar15 = 0;
        (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
        buffer_size << 2 != lVar15; lVar15 = lVar15 + 4) {
      uVar14 = *(int *)((long)(this->super_Compiler).ir.declared_capabilities.
                              super_VectorView<spv::Capability>.ptr + lVar15) - 0x1178;
      if ((uVar14 < 8) && ((0xc1U >> (uVar14 & 0x1f) & 1) != 0)) {
        this->ray_tracing_is_khr = true;
        goto LAB_0011971d;
      }
    }
    if ((this->ray_tracing_is_khr & 1U) == 0) {
      ::std::__cxx11::string::string((string *)&local_60,"GL_NV_ray_tracing",(allocator *)&local_40)
      ;
      require_extension_internal(this,&local_60);
    }
    else {
LAB_0011971d:
      ray_tracing_khr_fixup_locations(this);
      ::std::__cxx11::string::string
                ((string *)&local_60,"GL_EXT_ray_tracing",(allocator *)&local_40);
      require_extension_internal(this,&local_60);
    }
LAB_00119945:
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    if (EVar8 - ExecutionModelTessellationControl < 2) {
      bVar12 = (this->options).es;
      uVar14 = (this->options).version;
      if ((uVar14 < 0x140 & bVar12) == 1) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_EXT_tessellation_shader",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        bVar12 = (this->options).es;
        uVar14 = (this->options).version;
      }
      if (((bVar12 & 1) != 0) || (399 < uVar14)) goto LAB_0011994f;
      ::std::__cxx11::string::string
                ((string *)&local_60,"GL_ARB_tessellation_shader",(allocator *)&local_40);
      require_extension_internal(this,&local_60);
      goto LAB_00119945;
    }
    if (EVar8 - ExecutionModelTaskEXT < 2) {
      if (((this->options).es != false) || ((this->options).version < 0x1c2)) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"Mesh shaders require GLSL 450 or above.");
        goto LAB_0011a0bd;
      }
      if ((this->options).vulkan_semantics == false) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"Mesh shaders require Vulkan semantics.");
        goto LAB_0011a0bd;
      }
      ::std::__cxx11::string::string
                ((string *)&local_60,"GL_EXT_mesh_shader",(allocator *)&local_40);
      require_extension_internal(this,&local_60);
      goto LAB_00119945;
    }
    if (EVar8 == ExecutionModelGeometry) {
      bVar12 = (this->options).es;
      uVar14 = (this->options).version;
      if ((uVar14 < 0x140 & bVar12) == 1) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_EXT_geometry_shader",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        bVar12 = (this->options).es;
        uVar14 = (this->options).version;
      }
      if (((bVar12 & 1) == 0) && (uVar14 < 0x96)) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_ARB_geometry_shader4",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
      }
      if ((((((local_38->flags).lower & 1) != 0) && (local_38->invocations != 1)) &&
          ((this->options).es == false)) && ((this->options).version < 400)) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_ARB_gpu_shader5",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        goto LAB_00119945;
      }
    }
    else if (EVar8 == ExecutionModelGLCompute) {
      bVar12 = (this->options).es;
      uVar14 = (this->options).version;
      if (uVar14 < 0x1ae && (bool)bVar12 == false) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_ARB_compute_shader",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        bVar12 = (this->options).es;
        uVar14 = (this->options).version;
      }
      if (((bVar12 & 1) != 0) && (uVar14 < 0x136)) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"At least ESSL 3.10 required for compute shaders.");
        goto LAB_0011a0bd;
      }
    }
  }
LAB_0011994f:
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (local_38->model != ExecutionModelFragment) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar10,"Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
      goto LAB_0011a0bd;
    }
    ::std::__cxx11::string::string
              ((string *)&local_60,"GL_EXT_shader_pixel_local_storage",(allocator *)&local_40);
    require_extension_internal(this,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  ppVar11 = (this->inout_color_attachments).
            super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->inout_color_attachments).
           super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar5) {
    if (local_38->model != ExecutionModelFragment) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar10,"Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
      goto LAB_0011a0bd;
    }
    if ((this->options).vulkan_semantics != false) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar10,"Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");
      goto LAB_0011a0bd;
    }
    bVar13 = 0;
    bVar12 = 0;
    for (; ppVar11 != ppVar5; ppVar11 = ppVar11 + 1) {
      bVar12 = bVar12 | ppVar11->second;
      bVar13 = bVar13 | ppVar11->second ^ 1U;
    }
    if ((bVar12 & 1) != 0) {
      ::std::__cxx11::string::string
                ((string *)&local_60,"GL_EXT_shader_framebuffer_fetch",(allocator *)&local_40);
      require_extension_internal(this,&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
    if ((bVar13 & 1) != 0) {
      ::std::__cxx11::string::string
                ((string *)&local_60,"GL_EXT_shader_framebuffer_fetch_non_coherent",
                 (allocator *)&local_40);
      require_extension_internal(this,&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
  }
  if ((((this->options).separate_shader_objects == true) && ((this->options).es == false)) &&
     ((this->options).version < 0x19a)) {
    ::std::__cxx11::string::string
              ((string *)&local_60,"GL_ARB_separate_shader_objects",(allocator *)&local_40);
    require_extension_internal(this,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  AVar1 = (this->super_Compiler).ir.addressing_model;
  if (AVar1 != AddressingModelLogical) {
    if (AVar1 != AddressingModelPhysicalStorageBuffer64) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar10,
                 "Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
      goto LAB_0011a0bd;
    }
    if ((this->options).vulkan_semantics == false) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar10,"GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
      goto LAB_0011a0bd;
    }
    bVar7 = (this->options).es;
    uVar14 = (this->options).version;
    if ((uVar14 < 0x140 & bVar7) == 1) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar10,"GL_EXT_buffer_reference requires ESSL 320.");
      goto LAB_0011a0bd;
    }
    if (bVar7 == false && uVar14 < 0x1c2) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar10,"GL_EXT_buffer_reference requires GLSL 450.");
      goto LAB_0011a0bd;
    }
    ::std::__cxx11::string::string
              ((string *)&local_60,"GL_EXT_buffer_reference2",(allocator *)&local_40);
    require_extension_internal(this,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  pCVar6 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.ptr;
  sVar4 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
          buffer_size;
  for (lVar15 = 0; sVar4 << 2 != lVar15; lVar15 = lVar15 + 4) {
    iVar2 = *(int *)((long)pCVar6 + lVar15);
    if (iVar2 == 0x1157) {
      if ((this->options).vulkan_semantics == true) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_EXT_multiview",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        goto LAB_00119d84;
      }
      ::std::__cxx11::string::string((string *)&local_60,"GL_OVR_multiview2",(allocator *)&local_40)
      ;
      require_extension_internal(this,&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
      if ((this->options).ovr_multiview_view_count == 0) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar10,"ovr_multiview_view_count must be non-zero when using GL_OVR_multiview2."
                  );
      }
      else {
        EVar8 = Compiler::get_execution_model(&this->super_Compiler);
        if (EVar8 == ExecutionModelVertex) goto LAB_00119d8c;
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"OVR_multiview2 can only be used with Vertex shaders.")
        ;
      }
      goto LAB_0011a0bd;
    }
    if (iVar2 == 0x1178) {
      if ((((this->options).es != false) || ((this->options).version < 0x1cc)) ||
         ((this->options).vulkan_semantics == false)) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"RayQuery requires Vulkan GLSL 460.");
        goto LAB_0011a0bd;
      }
      ::std::__cxx11::string::string((string *)&local_60,"GL_EXT_ray_query",(allocator *)&local_40);
      require_extension_internal(this,&local_60);
LAB_00119d13:
      ::std::__cxx11::string::~string((string *)&local_60);
      this->ray_tracing_is_khr = true;
    }
    else {
      if (iVar2 == 0x117e) {
        if ((((this->options).es == false) && (0x1cb < (this->options).version)) &&
           ((this->options).vulkan_semantics != false)) {
          ::std::__cxx11::string::string
                    ((string *)&local_60,"GL_EXT_ray_flags_primitive_culling",(allocator *)&local_40
                    );
          require_extension_internal(this,&local_60);
          goto LAB_00119d13;
        }
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"RayQuery requires Vulkan GLSL 460.");
        goto LAB_0011a0bd;
      }
      if (iVar2 == 0x1483) {
        if (local_38->model == ExecutionModelGeometry) {
          ::std::__cxx11::string::string
                    ((string *)&local_60,"GL_NV_geometry_shader_passthrough",(allocator *)&local_40)
          ;
          require_extension_internal(this,&local_60);
          ::std::__cxx11::string::~string((string *)&local_60);
          local_38->geometry_passthrough = true;
        }
      }
      else {
        if (iVar2 == 0x14b5) {
          if ((this->options).vulkan_semantics == false) {
            ::std::__cxx11::string::string
                      ((string *)&local_60,"GL_NV_gpu_shader5",(allocator *)&local_40);
            require_extension_internal(this,&local_60);
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&local_60,"GL_EXT_nonuniform_qualifier",(allocator *)&local_40);
            require_extension_internal(this,&local_60);
          }
        }
        else {
          if (iVar2 != 0x14b6) {
            if (1 < iVar2 - 0x1159U) goto LAB_00119d8c;
            pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar10,"VariablePointers capability is not supported in GLSL.");
            goto LAB_0011a0bd;
          }
          if ((this->options).vulkan_semantics == false) {
            pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar10,"GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
            goto LAB_0011a0bd;
          }
          ::std::__cxx11::string::string
                    ((string *)&local_60,"GL_EXT_nonuniform_qualifier",(allocator *)&local_40);
          require_extension_internal(this,&local_60);
        }
LAB_00119d84:
        ::std::__cxx11::string::~string((string *)&local_60);
      }
    }
LAB_00119d8c:
  }
  if ((this->options).ovr_multiview_view_count != 0) {
    if ((this->options).vulkan_semantics == true) {
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar10,"OVR_multiview2 cannot be used with Vulkan semantics.");
    }
    else {
      EVar8 = Compiler::get_execution_model(&this->super_Compiler);
      if (EVar8 == ExecutionModelVertex) {
        ::std::__cxx11::string::string
                  ((string *)&local_60,"GL_OVR_multiview2",(allocator *)&local_40);
        require_extension_internal(this,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        goto LAB_00119de8;
      }
      pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar10,"OVR_multiview2 can only be used with Vertex shaders.");
    }
LAB_0011a0bd:
    __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_00119de8:
  __lhs = (this->super_Compiler).ir.declared_extensions.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr;
  for (lVar15 = (this->super_Compiler).ir.declared_extensions.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .buffer_size << 5; lVar15 != 0; lVar15 = lVar15 + -0x20) {
    bVar7 = ::std::operator==(__lhs,"SPV_NV_fragment_shader_barycentric");
    if (bVar7) {
      this->barycentric_is_nv = true;
    }
    __lhs = __lhs + 1;
  }
  return;
}

Assistant:

void CompilerGLSL::find_static_extensions()
{
	ir.for_each_typed_id<SPIRType>([&](uint32_t, const SPIRType &type) {
		if (type.basetype == SPIRType::Double)
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");
		}
		else if (type.basetype == SPIRType::Int64 || type.basetype == SPIRType::UInt64)
		{
			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");
		}
		else if (type.basetype == SPIRType::Half)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_float16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
		else if (type.basetype == SPIRType::SByte || type.basetype == SPIRType::UByte)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int8");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_8bit_storage");
		}
		else if (type.basetype == SPIRType::Short || type.basetype == SPIRType::UShort)
		{
			require_extension_internal("GL_EXT_shader_explicit_arithmetic_types_int16");
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_shader_16bit_storage");
		}
	});

	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelGLCompute:
		if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_compute_shader");
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for compute shaders.");
		break;

	case ExecutionModelGeometry:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_geometry_shader");
		if (!options.es && options.version < 150)
			require_extension_internal("GL_ARB_geometry_shader4");

		if (execution.flags.get(ExecutionModeInvocations) && execution.invocations != 1)
		{
			// Instanced GS is part of 400 core or this extension.
			if (!options.es && options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader5");
		}
		break;

	case ExecutionModelTessellationEvaluation:
	case ExecutionModelTessellationControl:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_tessellation_shader");
		if (!options.es && options.version < 400)
			require_extension_internal("GL_ARB_tessellation_shader");
		break;

	case ExecutionModelRayGenerationKHR:
	case ExecutionModelIntersectionKHR:
	case ExecutionModelAnyHitKHR:
	case ExecutionModelClosestHitKHR:
	case ExecutionModelMissKHR:
	case ExecutionModelCallableKHR:
		// NV enums are aliases.
		if (options.es || options.version < 460)
			SPIRV_CROSS_THROW("Ray tracing shaders require non-es profile with version 460 or above.");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Ray tracing requires Vulkan semantics.");

		// Need to figure out if we should target KHR or NV extension based on capabilities.
		for (auto &cap : ir.declared_capabilities)
		{
			if (cap == CapabilityRayTracingKHR || cap == CapabilityRayQueryKHR ||
			    cap == CapabilityRayTraversalPrimitiveCullingKHR)
			{
				ray_tracing_is_khr = true;
				break;
			}
		}

		if (ray_tracing_is_khr)
		{
			// In KHR ray tracing we pass payloads by pointer instead of location,
			// so make sure we assign locations properly.
			ray_tracing_khr_fixup_locations();
			require_extension_internal("GL_EXT_ray_tracing");
		}
		else
			require_extension_internal("GL_NV_ray_tracing");
		break;

	case ExecutionModelMeshEXT:
	case ExecutionModelTaskEXT:
		if (options.es || options.version < 450)
			SPIRV_CROSS_THROW("Mesh shaders require GLSL 450 or above.");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Mesh shaders require Vulkan semantics.");
		require_extension_internal("GL_EXT_mesh_shader");
		break;

	default:
		break;
	}

	if (!pls_inputs.empty() || !pls_outputs.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_pixel_local_storage in fragment shaders.");
		require_extension_internal("GL_EXT_shader_pixel_local_storage");
	}

	if (!inout_color_attachments.empty())
	{
		if (execution.model != ExecutionModelFragment)
			SPIRV_CROSS_THROW("Can only use GL_EXT_shader_framebuffer_fetch in fragment shaders.");
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot use EXT_shader_framebuffer_fetch in Vulkan GLSL.");

		bool has_coherent = false;
		bool has_incoherent = false;

		for (auto &att : inout_color_attachments)
		{
			if (att.second)
				has_coherent = true;
			else
				has_incoherent = true;
		}

		if (has_coherent)
			require_extension_internal("GL_EXT_shader_framebuffer_fetch");
		if (has_incoherent)
			require_extension_internal("GL_EXT_shader_framebuffer_fetch_non_coherent");
	}

	if (options.separate_shader_objects && !options.es && options.version < 410)
		require_extension_internal("GL_ARB_separate_shader_objects");

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference is only supported in Vulkan GLSL.");
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("GL_EXT_buffer_reference requires GLSL 450.");
		require_extension_internal("GL_EXT_buffer_reference2");
	}
	else if (ir.addressing_model != AddressingModelLogical)
	{
		SPIRV_CROSS_THROW("Only Logical and PhysicalStorageBuffer64EXT addressing models are supported.");
	}

	// Check for nonuniform qualifier and passthrough.
	// Instead of looping over all decorations to find this, just look at capabilities.
	for (auto &cap : ir.declared_capabilities)
	{
		switch (cap)
		{
		case CapabilityShaderNonUniformEXT:
			if (!options.vulkan_semantics)
				require_extension_internal("GL_NV_gpu_shader5");
			else
				require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;
		case CapabilityRuntimeDescriptorArrayEXT:
			if (!options.vulkan_semantics)
				SPIRV_CROSS_THROW("GL_EXT_nonuniform_qualifier is only supported in Vulkan GLSL.");
			require_extension_internal("GL_EXT_nonuniform_qualifier");
			break;

		case CapabilityGeometryShaderPassthroughNV:
			if (execution.model == ExecutionModelGeometry)
			{
				require_extension_internal("GL_NV_geometry_shader_passthrough");
				execution.geometry_passthrough = true;
			}
			break;

		case CapabilityVariablePointers:
		case CapabilityVariablePointersStorageBuffer:
			SPIRV_CROSS_THROW("VariablePointers capability is not supported in GLSL.");

		case CapabilityMultiView:
			if (options.vulkan_semantics)
				require_extension_internal("GL_EXT_multiview");
			else
			{
				require_extension_internal("GL_OVR_multiview2");
				if (options.ovr_multiview_view_count == 0)
					SPIRV_CROSS_THROW("ovr_multiview_view_count must be non-zero when using GL_OVR_multiview2.");
				if (get_execution_model() != ExecutionModelVertex)
					SPIRV_CROSS_THROW("OVR_multiview2 can only be used with Vertex shaders.");
			}
			break;

		case CapabilityRayQueryKHR:
			if (options.es || options.version < 460 || !options.vulkan_semantics)
				SPIRV_CROSS_THROW("RayQuery requires Vulkan GLSL 460.");
			require_extension_internal("GL_EXT_ray_query");
			ray_tracing_is_khr = true;
			break;

		case CapabilityRayTraversalPrimitiveCullingKHR:
			if (options.es || options.version < 460 || !options.vulkan_semantics)
				SPIRV_CROSS_THROW("RayQuery requires Vulkan GLSL 460.");
			require_extension_internal("GL_EXT_ray_flags_primitive_culling");
			ray_tracing_is_khr = true;
			break;

		default:
			break;
		}
	}

	if (options.ovr_multiview_view_count)
	{
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("OVR_multiview2 cannot be used with Vulkan semantics.");
		if (get_execution_model() != ExecutionModelVertex)
			SPIRV_CROSS_THROW("OVR_multiview2 can only be used with Vertex shaders.");
		require_extension_internal("GL_OVR_multiview2");
	}

	// KHR one is likely to get promoted at some point, so if we don't see an explicit SPIR-V extension, assume KHR.
	for (auto &ext : ir.declared_extensions)
		if (ext == "SPV_NV_fragment_shader_barycentric")
			barycentric_is_nv = true;
}